

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O2

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,RepeatStatement *repeat_stmt,void *data)

{
  SyntaxTree *pSVar1;
  ExpVarData exp_var_data;
  Guard g;
  Guard l;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  Guard local_38;
  
  local_98._8_8_ = this->current_function_->current_loop_;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:326:9)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:326:9)>
             ::_M_manager;
  local_80 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:326:9)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:326:9)>
             ::_M_manager;
  local_98._M_unused._M_object = this;
  local_78._M_unused._M_object = this;
  local_78._8_8_ = repeat_stmt;
  Guard::Guard(&local_38,(function<void_()> *)&local_78,(function<void_()> *)&local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:327:9)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:327:9)>
             ::_M_manager;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:327:9)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp:327:9)>
             ::_M_manager;
  local_98._M_unused._M_object = this;
  local_58._M_unused._M_object = this;
  Guard::Guard((Guard *)&local_78,(function<void_()> *)&local_98,(function<void_()> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  local_98._M_unused._M_member_pointer = 1;
  local_98._8_8_ = local_98._8_8_ & 0xffffffffffffff00;
  pSVar1 = (repeat_stmt->block_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,0);
  pSVar1 = (repeat_stmt->exp_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&local_98);
  Guard::~Guard((Guard *)&local_78);
  Guard::~Guard(&local_38);
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(RepeatStatement *repeat_stmt, void *data)
    {
        SEMANTIC_ANALYSIS_LOOP_GUARD(repeat_stmt);
        SEMANTIC_ANALYSIS_GUARD(EnterBlock, LeaveBlock);

        ExpVarData exp_var_data{ SemanticOp_Read };
        repeat_stmt->block_->Accept(this, nullptr);
        repeat_stmt->exp_->Accept(this, &exp_var_data);
    }